

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiber.c
# Opt level: O2

void probe_stack(char *sp0,size_t sz,size_t pgsz)

{
  ulong uVar1;
  char *sp;
  
  for (uVar1 = 0; uVar1 < sz; uVar1 = uVar1 + pgsz) {
    *(undefined8 *)sp0 = *(undefined8 *)sp0;
    sp0 = sp0 + -pgsz;
  }
  return;
}

Assistant:

HU_NOINLINE
static void
probe_stack(volatile char *sp0, size_t sz, size_t pgsz)
{
    volatile char *sp = sp0;
#if HU_COMP_GNUC_P
    __asm__ __volatile__("" : : "r"(sp) : "memory");
#endif
    size_t i = 0;
    while (i < sz) {
        *(volatile uintptr_t *) sp |= (uintptr_t) 0;
        i += pgsz;
        sp -= pgsz;
    }

#ifdef HAVE_probe_stack_weak_dummy
    _probe_stack_weak_dummy(sp0, sz);
#endif
}